

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

string * OpenMD::UpperCase(string *__return_storage_ptr__,string *S)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (S->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + S->_M_string_length);
  uVar3 = (ulong)(uint)__return_storage_ptr__->_M_string_length;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar4];
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        pcVar2[uVar4] = cVar1 + -0x20;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UpperCase(const std::string& S) {
    std::string uc = S;
    unsigned int n = uc.size();
    for (unsigned int j = 0; j < n; j++) {
      char sj = uc[j];
      if (sj >= 'a' && sj <= 'z') uc[j] = (char)(sj - ('a' - 'A'));
    }
    return uc;
  }